

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O0

void __thiscall
BezierCurve::Define(BezierCurve *this,positionTy *_start,positionTy *_mid,positionTy *_end)

{
  void *in_RCX;
  BezierCurve *in_RSI;
  void *in_RDI;
  ptTy pVar1;
  positionTy *in_stack_ffffffffffffffd0;
  undefined8 local_28;
  
  memcpy(in_RDI,in_RSI,0x48);
  pVar1 = positionTy::operator_cast_to_ptTy(in_stack_ffffffffffffffd0);
  *(double *)((long)in_RDI + 0x90) = pVar1.x;
  local_28 = pVar1.y;
  *(double *)((long)in_RDI + 0x98) = local_28;
  memcpy((void *)((long)in_RDI + 0x48),in_RCX,0x48);
  ConvertToMeter(in_RSI);
  return;
}

Assistant:

void BezierCurve::Define (const positionTy& _start,
                          const positionTy& _mid,
                          const positionTy& _end)
{
    // init
    start   = _start;
    ptCtrl  = _mid;
    end     = _end;
    
#ifdef DEBUG
    if (gSelAcCalc)
        LOG_MSG(logDEBUG, "Quadratic Bezier defined:\n%s",
                dbgTxt().c_str());
#endif

    // Convert all coordinates to meter
    ConvertToMeter();
}